

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O3

HCOSE_RECIPIENT COSE_Recipient_GetRecipient(HCOSE_RECIPIENT cose,int iRecipient,cose_errback *perr)

{
  _Bool _Var1;
  HCOSE_RECIPIENT p_Var2;
  
  if ((cose == (HCOSE_RECIPIENT)0x0) || (_Var1 = _COSE_IsInList(RecipientRoot,(COSE *)cose), !_Var1)
     ) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
  }
  else if (iRecipient < 0) {
LAB_001f62ab:
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else {
    p_Var2 = *(HCOSE_RECIPIENT *)(cose + 0x68);
    if (iRecipient != 0) {
      do {
        if (p_Var2 == (HCOSE_RECIPIENT)0x0) goto LAB_001f62ab;
        p_Var2 = *(HCOSE_RECIPIENT *)(p_Var2 + 0x70);
        iRecipient = iRecipient + -1;
      } while (iRecipient != 0);
    }
    if (p_Var2 != (HCOSE_RECIPIENT)0x0) {
      *(int *)(p_Var2 + 0x10) = *(int *)(p_Var2 + 0x10) + 1;
      return p_Var2;
    }
  }
  return (HCOSE_RECIPIENT)0x0;
}

Assistant:

HCOSE_RECIPIENT COSE_Recipient_GetRecipient(HCOSE_RECIPIENT cose, int iRecipient, cose_errback * perr)
{
	int i;
	COSE_RecipientInfo * p = NULL;

	CHECK_CONDITION(IsValidRecipientHandle(cose), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(iRecipient >= 0, COSE_ERR_INVALID_PARAMETER);

	p = ((COSE_RecipientInfo *)cose)->m_encrypt.m_recipientFirst;
	for (i = 0; i < iRecipient; i++) {
		CHECK_CONDITION(p != NULL, COSE_ERR_INVALID_PARAMETER);
		p = p->m_recipientNext;
	}
	if (p != NULL) p->m_encrypt.m_message.m_refCount++;

errorReturn:
	return (HCOSE_RECIPIENT)p;
}